

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O0

REF_STATUS ref_meshlink_parse(REF_GRID ref_grid,char *geom_filename)

{
  REF_GEOM ref_geom_00;
  int iVar1;
  uint uVar2;
  FILE *__stream;
  REF_INT local_578;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT id;
  REF_INT edges [2];
  REF_INT node;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_DBL param [2];
  int local_4c8;
  int status;
  REF_INT nodes [27];
  int local_450;
  uint local_44c;
  REF_INT new_cell;
  REF_INT gref;
  REF_INT nedge;
  REF_INT edge;
  REF_INT ntri;
  REF_INT tri;
  char line [1024];
  FILE *f;
  REF_GEOM ref_geom;
  char *geom_filename_local;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  memset(&ref_private_status_reis_ai,0,0x10);
  if (geom_filename == (char *)0x0) {
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("parsing %s\n",geom_filename);
    __stream = fopen(geom_filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",geom_filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
             0x7c,"ref_meshlink_parse","unable to open file");
      ref_grid_local._4_4_ = 2;
    }
    else {
      while ((iVar1 = feof(__stream), iVar1 == 0 &&
             (iVar1 = __isoc99_fscanf(__stream,"%s",&ntri), iVar1 != -1))) {
        if ((long)iVar1 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x80,"ref_meshlink_parse","line read failed",1,(long)iVar1);
          return 1;
        }
        iVar1 = strcmp("sheet",(char *)&ntri);
        if (iVar1 == 0) {
          iVar1 = __isoc99_fscanf(__stream,"%d %d",&nedge,&local_44c);
          if ((long)iVar1 != 2) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                   ,0x83,"ref_meshlink_parse","sheet size gref",2,(long)iVar1);
            return 1;
          }
          printf("sheet ntri %d gref %d\n",(ulong)(uint)nedge,(ulong)local_44c);
          for (edge = 0; edge < nedge; edge = edge + 1) {
            iVar1 = __isoc99_fscanf(__stream,"%d %d %d",&local_4c8,&status,nodes);
            if ((long)iVar1 != 3) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x87,"ref_meshlink_parse","tri nodes",3,(long)iVar1);
              return 1;
            }
            local_4c8 = local_4c8 + -1;
            status = status + -1;
            nodes[0] = nodes[0] + -1;
            nodes[1] = local_44c;
            uVar2 = ref_cell_with(ref_grid->cell[3],&local_4c8,&local_450);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x8d,"ref_meshlink_parse",(ulong)uVar2,"tri for sheet missing");
              return uVar2;
            }
            ref_grid->cell[3]->c2n[ref_grid->cell[3]->size_per * local_450 + 3] = nodes[1];
            uVar2 = ref_geom_add(ref_geom_00,local_4c8,2,nodes[1],
                                 (REF_DBL *)&ref_private_status_reis_ai);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x90,"ref_meshlink_parse",(ulong)uVar2,"face uv");
              return uVar2;
            }
            uVar2 = ref_geom_add(ref_geom_00,status,2,nodes[1],
                                 (REF_DBL *)&ref_private_status_reis_ai);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x92,"ref_meshlink_parse",(ulong)uVar2,"face uv");
              return uVar2;
            }
            uVar2 = ref_geom_add(ref_geom_00,nodes[0],2,nodes[1],
                                 (REF_DBL *)&ref_private_status_reis_ai);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x94,"ref_meshlink_parse",(ulong)uVar2,"face uv");
              return uVar2;
            }
          }
        }
        iVar1 = strcmp("string",(char *)&ntri);
        if (iVar1 == 0) {
          iVar1 = __isoc99_fscanf(__stream,"%d %d",&new_cell,&local_44c);
          if ((long)iVar1 != 2) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                   ,0x99,"ref_meshlink_parse","string size gref",2,(long)iVar1);
            return 1;
          }
          printf("sheet ntri %d gref %d\n",(ulong)(uint)new_cell,(ulong)local_44c);
          for (gref = 0; gref < new_cell; gref = gref + 1) {
            iVar1 = __isoc99_fscanf(__stream,"%d %d",&local_4c8,&status);
            if ((long)iVar1 != 2) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x9c,"ref_meshlink_parse","edge nodes",2,(long)iVar1);
              return 1;
            }
            local_4c8 = local_4c8 + -1;
            status = status + -1;
            nodes[0] = local_44c;
            uVar2 = ref_cell_add(ref_grid->cell[0],&local_4c8,&local_450);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0xa1,"ref_meshlink_parse",(ulong)uVar2,"add edg for string");
              return uVar2;
            }
            uVar2 = ref_geom_add(ref_geom_00,local_4c8,1,nodes[0],
                                 (REF_DBL *)&ref_private_status_reis_ai);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0xa3,"ref_meshlink_parse",(ulong)uVar2,"edge t");
              return uVar2;
            }
            edges[1] = ref_geom_add(ref_geom_00,status,1,nodes[0],
                                    (REF_DBL *)&ref_private_status_reis_ai);
            if (edges[1] != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0xa5,"ref_meshlink_parse",(ulong)(uint)edges[1],"edge t");
              return edges[1];
            }
            edges[1] = 0;
          }
        }
      }
      fclose(__stream);
      for (edges[0] = 0; edges[0] < ref_grid->node->max; edges[0] = edges[0] + 1) {
        if (((-1 < edges[0]) && (edges[0] < ref_grid->node->max)) &&
           (-1 < ref_grid->node->global[edges[0]])) {
          uVar2 = ref_cell_id_list_around
                            (ref_grid->cell[0],edges[0],2,&new_cell,&ref_private_macro_code_rxs);
          if ((uVar2 != 0) && (uVar2 != 7)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                   ,0xb2,"ref_meshlink_parse",(ulong)uVar2,"count edgeids");
            return uVar2;
          }
          if (1 < new_cell) {
            if (((edges[0] < 0) || (ref_grid->node->max <= edges[0])) ||
               (ref_grid->node->global[edges[0]] < 0)) {
              local_578 = -1;
            }
            else {
              local_578 = (REF_INT)ref_grid->node->global[edges[0]];
            }
            uVar2 = ref_geom_add(ref_geom_00,edges[0],0,local_578,
                                 (REF_DBL *)&ref_private_status_reis_ai);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0xb5,"ref_meshlink_parse",(ulong)uVar2,"node");
              return uVar2;
            }
          }
        }
      }
      ref_grid_local._4_4_ = 0;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_parse(REF_GRID ref_grid,
                                      const char *geom_filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *f = NULL;
  char line[1024];
  REF_INT tri, ntri, edge, nedge, gref, new_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  int status;
  REF_DBL param[2] = {0.0, 0.0};
  if (NULL == geom_filename) return REF_SUCCESS;
  printf("parsing %s\n", geom_filename);
  f = fopen(geom_filename, "r");
  if (NULL == (void *)f) printf("unable to open %s\n", geom_filename);
  RNS(f, "unable to open file");
  while (!feof(f)) {
    status = fscanf(f, "%s", line);
    if (EOF == status) break;
    REIS(1, status, "line read failed");

    if (0 == strcmp("sheet", line)) {
      REIS(2, fscanf(f, "%d %d", &ntri, &gref), "sheet size gref");
      printf("sheet ntri %d gref %d\n", ntri, gref);
      for (tri = 0; tri < ntri; tri++) {
        REIS(3, fscanf(f, "%d %d %d", &(nodes[0]), &(nodes[1]), &(nodes[2])),
             "tri nodes");
        (nodes[0])--;
        (nodes[1])--;
        (nodes[2])--;
        nodes[3] = gref;
        RSS(ref_cell_with(ref_grid_tri(ref_grid), nodes, &new_cell),
            "tri for sheet missing");
        ref_cell_c2n(ref_grid_tri(ref_grid), 3, new_cell) = nodes[3];
        RSS(ref_geom_add(ref_geom, nodes[0], REF_GEOM_FACE, nodes[3], param),
            "face uv");
        RSS(ref_geom_add(ref_geom, nodes[1], REF_GEOM_FACE, nodes[3], param),
            "face uv");
        RSS(ref_geom_add(ref_geom, nodes[2], REF_GEOM_FACE, nodes[3], param),
            "face uv");
      }
    }

    if (0 == strcmp("string", line)) {
      REIS(2, fscanf(f, "%d %d", &nedge, &gref), "string size gref");
      printf("sheet ntri %d gref %d\n", nedge, gref);
      for (edge = 0; edge < nedge; edge++) {
        REIS(2, fscanf(f, "%d %d", &(nodes[0]), &(nodes[1])), "edge nodes");
        (nodes[0])--;
        (nodes[1])--;
        nodes[2] = gref;
        RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
            "add edg for string");
        RSS(ref_geom_add(ref_geom, nodes[0], REF_GEOM_EDGE, nodes[2], param),
            "edge t");
        RSS(ref_geom_add(ref_geom, nodes[1], REF_GEOM_EDGE, nodes[2], param),
            "edge t");
      }
    }
  }
  fclose(f);

  { /* mark cad nodes */
    REF_INT node;
    REF_INT edges[2];
    REF_INT id;
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      RXS(ref_cell_id_list_around(ref_grid_edg(ref_grid), node, 2, &nedge,
                                  edges),
          REF_INCREASE_LIMIT, "count edgeids");
      if (nedge > 1) {
        id = (REF_INT)ref_node_global(ref_grid_node(ref_grid), node);
        RSS(ref_geom_add(ref_geom, node, REF_GEOM_NODE, id, param), "node");
      }
    }
  }

  return REF_SUCCESS;
}